

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11wm.cpp
# Opt level: O2

void __thiscall rw::X11WM::move_resize_window(X11WM *this,Window *window,int x,int y,uint w,uint h)

{
  int iVar1;
  ostream *poVar2;
  XEvent event;
  
  event.type = 0x21;
  event.xany.serial = 0;
  event.xany.send_event = 1;
  event.xkey.root = this->_NET_MOVERESIZE_WINDOW;
  event.xany.window = (Window)window->window_id;
  event.xexpose.width = 0x20;
  event.xkey.time = 0x2f00;
  event.xselectionrequest.property = (Atom)x;
  event.xconfigure.above = (Window)y;
  event.pad[10] = (long)w;
  event.xconfigurerequest.value_mask = (unsigned_long)h;
  iVar1 = XSendEvent(this->display,this->root_window,0,0x180000,&event);
  if (iVar1 != 0) {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "Could not send event to move and resize the window.");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(2);
}

Assistant:

void X11WM::move_resize_window(const Window * window, int x, int y, unsigned int w, unsigned int h) {
        XEvent event;
        long mask = SubstructureRedirectMask | SubstructureNotifyMask;

        unsigned long gravity_flags = 0;
        // All x, y, w and h are set
        gravity_flags |= (1 << 8);
        gravity_flags |= (1 << 9);
        gravity_flags |= (1 << 10);
        gravity_flags |= (1 << 11);
        gravity_flags |= (1 << 13);

        event.xclient.type = ClientMessage;
        event.xclient.serial = 0;
        event.xclient.send_event = True;
        event.xclient.message_type = _NET_MOVERESIZE_WINDOW;
        event.xclient.window = window->window_id;
        event.xclient.format = 32;
        event.xclient.data.l[0] = (unsigned long) gravity_flags;
        event.xclient.data.l[1] = (unsigned long) x;
        event.xclient.data.l[2] = (unsigned long) y;
        event.xclient.data.l[3] = (unsigned long) w;
        event.xclient.data.l[4] = (unsigned long) h;

        if (!XSendEvent(display, root_window, False, mask, &event)) {
            cerr << "Could not send event to move and resize the window." << endl;
            exit(2);
        }
    }